

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp.c
# Opt level: O1

CURLcode ftp_statemach_act(connectdata *conn)

{
  anon_union_240_10_26c073a1_for_proto *pp;
  int *piVar1;
  ftpstate instate;
  curl_usessl cVar2;
  Curl_easy *data;
  CURLcode CVar3;
  CURLcode CVar4;
  int iVar5;
  byte *pbVar6;
  byte *pbVar7;
  byte *pbVar8;
  long lVar9;
  byte bVar10;
  undefined8 uVar11;
  char *pcVar12;
  ulong uVar13;
  byte *pbVar14;
  int iVar15;
  size_t nread;
  int ftpcode;
  size_t local_40;
  uint local_34;
  
  data = conn->data;
  pp = &conn->proto;
  local_40 = 0;
  if ((conn->proto).ftpc.pp.sendleft != 0) {
    CVar3 = Curl_pp_flushsend(&(pp->ftpc).pp);
    return CVar3;
  }
  CVar3 = ftp_readresp(conn->sock[0],&(pp->ftpc).pp,(int *)&local_34,&local_40);
  if (CVar3 != CURLE_OK) {
    return CVar3;
  }
  CVar3 = CURLE_OK;
  if (local_34 == 0) {
    return CURLE_OK;
  }
  instate = (conn->proto).ftpc.state;
  switch(instate) {
  case FTP_WAIT220:
    if (local_34 != 0xdc) {
      if (local_34 != 0xe6) {
        Curl_failf(data,"Got a %03d ftp-server response when 220 was expected",(ulong)local_34);
        return CURLE_WEIRD_SERVER_REPLY;
      }
      CVar3 = ftp_state_loggedin(conn);
      return CVar3;
    }
    if (((data->set).use_ssl != CURLUSESSL_NONE) &&
       ((conn->ssl[0].use != true ||
        (((conn->bits).proxy_ssl_connected[0] == true && (conn->proxy_ssl[0].use == false)))))) {
      (conn->proto).ftpc.count3 = 0;
      uVar13 = (ulong)(data->set).ftpsslauth;
      if (2 < uVar13) {
        Curl_failf(data,"unsupported parameter to CURLOPT_FTPSSLAUTH: %d");
        return CURLE_UNKNOWN_OPTION;
      }
      iVar15 = *(int *)(&DAT_001523f0 + uVar13 * 4);
      (conn->proto).ftpc.count2 = *(int *)(&DAT_001523e4 + uVar13 * 4);
      (conn->proto).ftpc.count1 = iVar15;
      CVar3 = Curl_pp_sendf(&(pp->ftpc).pp,"AUTH %s",ftp_statemach_act::ftpauth + iVar15);
      if (CVar3 == CURLE_OK) {
        (conn->proto).ftpc.state = FTP_AUTH;
        return CURLE_OK;
      }
      return CVar3;
    }
    CVar4 = ftp_state_user(conn);
    goto joined_r0x0011689d;
  case FTP_AUTH:
    if ((local_34 == 0x14e) || (local_34 == 0xea)) {
      CVar4 = Curl_ssl_connect(conn,0);
      if (CVar4 == CURLE_OK) {
        (conn->bits).ftp_use_data_ssl = false;
LAB_00116760:
        CVar4 = ftp_state_user(conn);
      }
    }
    else {
      iVar15 = (conn->proto).ftpc.count3;
      if (iVar15 < 1) {
        (conn->proto).ftpc.count3 = iVar15 + 1;
        lVar9 = (long)(conn->proto).ftpc.count1 + (long)(conn->proto).ftpc.count2;
        (conn->proto).ftpc.count1 = (int)lVar9;
        CVar4 = Curl_pp_sendf(&(pp->ftpc).pp,"AUTH %s",ftp_statemach_act::ftpauth + lVar9);
      }
      else {
        CVar4 = CURLE_USE_SSL_FAILED;
        if ((data->set).use_ssl < CURLUSESSL_CONTROL) goto LAB_00116760;
      }
    }
    goto joined_r0x0011689d;
  case FTP_USER:
  case FTP_PASS:
    CVar3 = ftp_state_user_resp(conn,local_34,instate);
    break;
  case FTP_ACCT:
    CVar3 = ftp_state_acct_resp(conn,local_34);
    break;
  case FTP_PBSZ:
    uVar11 = 0x50;
    if ((data->set).use_ssl == CURLUSESSL_CONTROL) {
      uVar11 = 0x43;
    }
    CVar3 = CURLE_OK;
    CVar4 = Curl_pp_sendf(&(pp->ftpc).pp,"PROT %c",uVar11);
    if (CVar4 != CURLE_OK) {
      return CVar4;
    }
    (conn->proto).ftpc.state = FTP_PROT;
    break;
  case FTP_PROT:
    cVar2 = (data->set).use_ssl;
    if (local_34 - 200 < 100) {
      (conn->bits).ftp_use_data_ssl = cVar2 != CURLUSESSL_CONTROL;
    }
    else if (CURLUSESSL_CONTROL < cVar2) {
      return CURLE_USE_SSL_FAILED;
    }
    if ((data->set).ftp_ccc != CURLFTPSSL_CCC_NONE) {
      CVar3 = Curl_pp_sendf(&(pp->ftpc).pp,"%s","CCC");
      if (CVar3 == CURLE_OK) {
        (conn->proto).ftpc.state = FTP_CCC;
        return CURLE_OK;
      }
      return CVar3;
    }
    goto LAB_00116691;
  case FTP_CCC:
    if (((int)local_34 < 500) && (CVar3 = Curl_ssl_shutdown(conn,0), CVar3 != CURLE_OK)) {
      Curl_failf(conn->data,"Failed to clear the command channel (CCC)");
      return CVar3;
    }
LAB_00116691:
    CVar4 = Curl_pp_sendf(&(pp->ftpc).pp,"%s","PWD");
    if (CVar4 == CURLE_OK) {
      (conn->proto).ftpc.state = FTP_PWD;
      CVar4 = CURLE_OK;
    }
    goto joined_r0x0011689d;
  case FTP_PWD:
    CVar3 = CURLE_OK;
    if (local_34 == 0x101) {
      pcVar12 = (data->state).buffer;
      lVar9 = (data->set).buffer_size;
      pbVar6 = (byte *)(*Curl_cmalloc)(local_40 + 1);
      iVar15 = 1;
      if (pbVar6 != (byte *)0x0) {
        pbVar14 = (byte *)(pcVar12 + 4);
        while ((pbVar14 < (data->state).buffer + lVar9 &&
               ((0x22 < (ulong)*pbVar14 || ((0x400000401U >> ((ulong)*pbVar14 & 0x3f) & 1) == 0)))))
        {
          pbVar14 = pbVar14 + 1;
        }
        pbVar8 = pbVar6;
        if (*pbVar14 == 0x22) {
          do {
            bVar10 = pbVar14[1];
            if (bVar10 == 0x22) {
              if (pbVar14[2] != 0x22) {
                *pbVar8 = 0;
                if (((conn->proto).ftpc.server_os != (char *)0x0) || (*pbVar6 == 0x2f)) {
                  (*Curl_cfree)((conn->proto).ftpc.entrypath);
                  (conn->proto).ftpc.entrypath = (char *)pbVar6;
                  Curl_infof(data,"Entry path is \'%s\'\n",pbVar6);
                  (data->state).most_recent_ftp_entrypath = (conn->proto).ftpc.entrypath;
                  goto LAB_00116940;
                }
                CVar3 = CURLE_OK;
                CVar4 = Curl_pp_sendf(&(pp->ftpc).pp,"%s","SYST");
                if (CVar4 == CURLE_OK) {
                  (*Curl_cfree)((conn->proto).ftpc.entrypath);
                  (conn->proto).ftpc.entrypath = (char *)pbVar6;
                  Curl_infof(data,"Entry path is \'%s\'\n",pbVar6);
                  (data->state).most_recent_ftp_entrypath = (conn->proto).ftpc.entrypath;
                  (conn->proto).ftpc.state = FTP_SYST;
                  iVar15 = 2;
                }
                else {
                  (*Curl_cfree)(pbVar6);
                  iVar15 = 1;
                  CVar3 = CVar4;
                }
                goto joined_r0x00116978;
              }
              pbVar14 = pbVar14 + 2;
              bVar10 = 0x22;
            }
            else {
              if (bVar10 == 0) goto LAB_001168c9;
              pbVar14 = pbVar14 + 1;
            }
            *pbVar8 = bVar10;
            pbVar8 = pbVar8 + 1;
          } while( true );
        }
        goto LAB_001168cc;
      }
      CVar4 = CURLE_OUT_OF_MEMORY;
      CVar3 = CURLE_OK;
      goto joined_r0x00116978;
    }
  default:
switchD_00116211_default:
    (conn->proto).ftpc.state = FTP_STOP;
    break;
  case FTP_SYST:
    CVar3 = CURLE_OK;
    if (local_34 == 0xd7) {
      pcVar12 = (data->state).buffer;
      pbVar6 = (byte *)(*Curl_cmalloc)(local_40 + 1);
      iVar15 = 1;
      if (pbVar6 == (byte *)0x0) {
        pbVar14 = (byte *)0x1b;
        CVar3 = CURLE_OK;
      }
      else {
        pbVar14 = (byte *)(pcVar12 + 3);
        do {
          pbVar8 = pbVar14 + 1;
          pbVar14 = pbVar14 + 1;
          pbVar7 = pbVar6;
        } while (*pbVar8 == 0x20);
        for (; (*pbVar14 & 0xdf) != 0; pbVar14 = pbVar14 + 1) {
          *pbVar7 = *pbVar14;
          pbVar7 = pbVar7 + 1;
        }
        *pbVar7 = 0;
        iVar5 = Curl_strcasecompare((char *)pbVar6,"OS/400");
        if (iVar5 == 0) {
          (*Curl_cfree)((conn->proto).ftpc.server_os);
          (conn->proto).ftpc.server_os = (char *)pbVar6;
          iVar15 = 0;
          CVar3 = CURLE_OK;
        }
        else {
          CVar3 = CURLE_OK;
          CVar4 = Curl_pp_sendf(&(pp->ftpc).pp,"%s","SITE NAMEFMT 1");
          pbVar14 = (byte *)(ulong)CVar4;
          if (CVar4 == CURLE_OK) {
            (*Curl_cfree)((conn->proto).ftpc.server_os);
            (conn->proto).ftpc.server_os = (char *)pbVar6;
            (conn->proto).ftpc.state = FTP_NAMEFMT;
            iVar15 = 2;
          }
          else {
            (*Curl_cfree)(pbVar6);
            CVar3 = CVar4;
          }
        }
      }
      CVar4 = (CURLcode)pbVar14;
      goto joined_r0x00116978;
    }
    goto switchD_00116211_default;
  case FTP_NAMEFMT:
    if (local_34 == 0xfa) {
      CVar3 = Curl_pp_sendf(&(pp->ftpc).pp,"%s","PWD");
      if (CVar3 != CURLE_OK) {
        return CURLE_OK;
      }
      (conn->proto).ftpc.state = FTP_PWD;
      return CURLE_OK;
    }
    goto switchD_00116211_default;
  case FTP_QUOTE:
  case FTP_RETR_PREQUOTE:
  case FTP_STOR_PREQUOTE:
  case FTP_POSTQUOTE:
    if ((399 < (int)local_34) && ((conn->proto).ftpc.count2 == 0)) {
      Curl_failf(conn->data,"QUOT command failed with %03d",(ulong)local_34);
      return CURLE_QUOTE_ERROR;
    }
    CVar4 = ftp_state_quote(conn,false,instate);
    goto joined_r0x0011689d;
  case FTP_CWD:
    if (99 < local_34 - 200) {
      if ((((conn->data->set).ftp_create_missing_dirs != 0) &&
          (lVar9 = (long)(conn->proto).ftpc.cwdcount, lVar9 != 0)) &&
         ((conn->proto).ftpc.count2 == 0)) {
        (conn->proto).ftpc.count2 = 1;
        CVar3 = Curl_pp_sendf(&(pp->ftpc).pp,"MKD %s",
                              *(undefined8 *)(((conn->proto).pop3c.eob - 8) + lVar9 * 8));
        if (CVar3 == CURLE_OK) {
          (conn->proto).ftpc.state = FTP_MKD;
          return CURLE_OK;
        }
        return CVar3;
      }
      Curl_failf(data,"Server denied you to change to the given directory");
      (conn->proto).ftpc.cwdfail = true;
      return CURLE_REMOTE_ACCESS_DENIED;
    }
    (conn->proto).ftpc.count2 = 0;
    iVar15 = (conn->proto).ftpc.cwdcount;
    (conn->proto).ftpc.cwdcount = iVar15 + 1;
    if (iVar15 < (conn->proto).ftpc.dirdepth) {
      pcVar12 = (conn->proto).ftpc.dirs[iVar15];
      goto LAB_001165c7;
    }
    CVar4 = ftp_state_mdtm(conn);
    goto joined_r0x0011689d;
  case FTP_MKD:
    if (99 < local_34 - 200) {
      piVar1 = &(conn->proto).ftpc.count3;
      iVar15 = *piVar1;
      *piVar1 = *piVar1 + -1;
      if (iVar15 == 0) {
        Curl_failf(data,"Failed to MKD dir: %03d",(ulong)local_34);
        return CURLE_REMOTE_ACCESS_DENIED;
      }
    }
    (conn->proto).ftpc.state = FTP_CWD;
    pcVar12 = *(char **)(((conn->proto).pop3c.eob - 8) + (long)(conn->proto).ftpc.cwdcount * 8);
LAB_001165c7:
    CVar4 = Curl_pp_sendf(&(pp->ftpc).pp,"CWD %s",pcVar12);
joined_r0x0011689d:
    CVar3 = CURLE_OK;
    if (CVar4 != CURLE_OK) {
      return CVar4;
    }
    break;
  case FTP_MDTM:
    CVar3 = ftp_state_mdtm_resp(conn,local_34);
    break;
  case FTP_TYPE:
  case FTP_LIST_TYPE:
  case FTP_RETR_TYPE:
  case FTP_STOR_TYPE:
    CVar3 = ftp_state_type_resp(conn,local_34,instate);
    break;
  case FTP_SIZE:
  case FTP_RETR_SIZE:
  case FTP_STOR_SIZE:
    CVar3 = ftp_state_size_resp(conn,local_34,instate);
    break;
  case FTP_REST:
  case FTP_RETR_REST:
    CVar3 = ftp_state_rest_resp(conn,local_34,instate);
    break;
  case FTP_PORT:
    CVar3 = ftp_state_port_resp(conn,local_34);
    break;
  case FTP_PRET:
    if (local_34 != 200) {
      Curl_failf(data,"PRET command not accepted: %03d",(ulong)local_34);
      return CURLE_FTP_PRET_FAILED;
    }
    CVar3 = ftp_state_use_pasv(conn);
    break;
  case FTP_PASV:
    CVar3 = ftp_state_pasv_resp(conn,local_34);
    break;
  case FTP_LIST:
  case FTP_RETR:
    CVar3 = ftp_state_get_resp(conn,local_34,instate);
    break;
  case FTP_STOR:
    CVar3 = ftp_state_stor_resp(conn,local_34,instate);
  }
  return CVar3;
LAB_001168c9:
  *pbVar8 = 0;
LAB_001168cc:
  (*Curl_cfree)(pbVar6);
  Curl_infof(data,"Failed to figure out path\n");
LAB_00116940:
  CVar4 = (CURLcode)pbVar14;
  iVar15 = 0;
  CVar3 = CURLE_OK;
joined_r0x00116978:
  if (iVar15 == 2) {
    return CVar3;
  }
  if (iVar15 != 0) {
    return CVar4;
  }
  goto switchD_00116211_default;
}

Assistant:

static CURLcode ftp_statemach_act(struct connectdata *conn)
{
  CURLcode result;
  curl_socket_t sock = conn->sock[FIRSTSOCKET];
  struct Curl_easy *data = conn->data;
  int ftpcode;
  struct ftp_conn *ftpc = &conn->proto.ftpc;
  struct pingpong *pp = &ftpc->pp;
  static const char ftpauth[][4]  = { "SSL", "TLS" };
  size_t nread = 0;

  if(pp->sendleft)
    return Curl_pp_flushsend(pp);

  result = ftp_readresp(sock, pp, &ftpcode, &nread);
  if(result)
    return result;

  if(ftpcode) {
    /* we have now received a full FTP server response */
    switch(ftpc->state) {
    case FTP_WAIT220:
      if(ftpcode == 230)
        /* 230 User logged in - already! */
        return ftp_state_user_resp(conn, ftpcode, ftpc->state);
      else if(ftpcode != 220) {
        failf(data, "Got a %03d ftp-server response when 220 was expected",
              ftpcode);
        return CURLE_WEIRD_SERVER_REPLY;
      }

      /* We have received a 220 response fine, now we proceed. */
#ifdef HAVE_GSSAPI
      if(data->set.krb) {
        /* If not anonymous login, try a secure login. Note that this
           procedure is still BLOCKING. */

        Curl_sec_request_prot(conn, "private");
        /* We set private first as default, in case the line below fails to
           set a valid level */
        Curl_sec_request_prot(conn, data->set.str[STRING_KRB_LEVEL]);

        if(Curl_sec_login(conn))
          infof(data, "Logging in with password in cleartext!\n");
        else
          infof(data, "Authentication successful\n");
      }
#endif

      if(data->set.use_ssl &&
         (!conn->ssl[FIRSTSOCKET].use ||
          (conn->bits.proxy_ssl_connected[FIRSTSOCKET] &&
           !conn->proxy_ssl[FIRSTSOCKET].use))) {
        /* We don't have a SSL/TLS connection yet, but FTPS is
           requested. Try a FTPS connection now */

        ftpc->count3 = 0;
        switch(data->set.ftpsslauth) {
        case CURLFTPAUTH_DEFAULT:
        case CURLFTPAUTH_SSL:
          ftpc->count2 = 1; /* add one to get next */
          ftpc->count1 = 0;
          break;
        case CURLFTPAUTH_TLS:
          ftpc->count2 = -1; /* subtract one to get next */
          ftpc->count1 = 1;
          break;
        default:
          failf(data, "unsupported parameter to CURLOPT_FTPSSLAUTH: %d",
                (int)data->set.ftpsslauth);
          return CURLE_UNKNOWN_OPTION; /* we don't know what to do */
        }
        PPSENDF(&ftpc->pp, "AUTH %s", ftpauth[ftpc->count1]);
        state(conn, FTP_AUTH);
      }
      else {
        result = ftp_state_user(conn);
        if(result)
          return result;
      }

      break;

    case FTP_AUTH:
      /* we have gotten the response to a previous AUTH command */

      /* RFC2228 (page 5) says:
       *
       * If the server is willing to accept the named security mechanism,
       * and does not require any security data, it must respond with
       * reply code 234/334.
       */

      if((ftpcode == 234) || (ftpcode == 334)) {
        /* Curl_ssl_connect is BLOCKING */
        result = Curl_ssl_connect(conn, FIRSTSOCKET);
        if(!result) {
          conn->bits.ftp_use_data_ssl = FALSE; /* clear-text data */
          result = ftp_state_user(conn);
        }
      }
      else if(ftpc->count3 < 1) {
        ftpc->count3++;
        ftpc->count1 += ftpc->count2; /* get next attempt */
        result = Curl_pp_sendf(&ftpc->pp, "AUTH %s", ftpauth[ftpc->count1]);
        /* remain in this same state */
      }
      else {
        if(data->set.use_ssl > CURLUSESSL_TRY)
          /* we failed and CURLUSESSL_CONTROL or CURLUSESSL_ALL is set */
          result = CURLE_USE_SSL_FAILED;
        else
          /* ignore the failure and continue */
          result = ftp_state_user(conn);
      }

      if(result)
        return result;
      break;

    case FTP_USER:
    case FTP_PASS:
      result = ftp_state_user_resp(conn, ftpcode, ftpc->state);
      break;

    case FTP_ACCT:
      result = ftp_state_acct_resp(conn, ftpcode);
      break;

    case FTP_PBSZ:
      PPSENDF(&ftpc->pp, "PROT %c",
              data->set.use_ssl == CURLUSESSL_CONTROL ? 'C' : 'P');
      state(conn, FTP_PROT);

      break;

    case FTP_PROT:
      if(ftpcode/100 == 2)
        /* We have enabled SSL for the data connection! */
        conn->bits.ftp_use_data_ssl =
          (data->set.use_ssl != CURLUSESSL_CONTROL) ? TRUE : FALSE;
      /* FTP servers typically responds with 500 if they decide to reject
         our 'P' request */
      else if(data->set.use_ssl > CURLUSESSL_CONTROL)
        /* we failed and bails out */
        return CURLE_USE_SSL_FAILED;

      if(data->set.ftp_ccc) {
        /* CCC - Clear Command Channel
         */
        PPSENDF(&ftpc->pp, "%s", "CCC");
        state(conn, FTP_CCC);
      }
      else {
        result = ftp_state_pwd(conn);
        if(result)
          return result;
      }
      break;

    case FTP_CCC:
      if(ftpcode < 500) {
        /* First shut down the SSL layer (note: this call will block) */
        result = Curl_ssl_shutdown(conn, FIRSTSOCKET);

        if(result) {
          failf(conn->data, "Failed to clear the command channel (CCC)");
          return result;
        }
      }

      /* Then continue as normal */
      result = ftp_state_pwd(conn);
      if(result)
        return result;
      break;

    case FTP_PWD:
      if(ftpcode == 257) {
        char *ptr = &data->state.buffer[4];  /* start on the first letter */
        const size_t buf_size = data->set.buffer_size;
        char *dir;
        bool entry_extracted = FALSE;

        dir = malloc(nread + 1);
        if(!dir)
          return CURLE_OUT_OF_MEMORY;

        /* Reply format is like
           257<space>[rubbish]"<directory-name>"<space><commentary> and the
           RFC959 says

           The directory name can contain any character; embedded
           double-quotes should be escaped by double-quotes (the
           "quote-doubling" convention).
        */

        /* scan for the first double-quote for non-standard responses */
        while(ptr < &data->state.buffer[buf_size]
              && *ptr != '\n' && *ptr != '\0' && *ptr != '"')
          ptr++;

        if('\"' == *ptr) {
          /* it started good */
          char *store;
          ptr++;
          for(store = dir; *ptr;) {
            if('\"' == *ptr) {
              if('\"' == ptr[1]) {
                /* "quote-doubling" */
                *store = ptr[1];
                ptr++;
              }
              else {
                /* end of path */
                entry_extracted = TRUE;
                break; /* get out of this loop */
              }
            }
            else
              *store = *ptr;
            store++;
            ptr++;
          }
          *store = '\0'; /* zero terminate */
        }
        if(entry_extracted) {
          /* If the path name does not look like an absolute path (i.e.: it
             does not start with a '/'), we probably need some server-dependent
             adjustments. For example, this is the case when connecting to
             an OS400 FTP server: this server supports two name syntaxes,
             the default one being incompatible with standard paths. In
             addition, this server switches automatically to the regular path
             syntax when one is encountered in a command: this results in
             having an entrypath in the wrong syntax when later used in CWD.
               The method used here is to check the server OS: we do it only
             if the path name looks strange to minimize overhead on other
             systems. */

          if(!ftpc->server_os && dir[0] != '/') {

            result = Curl_pp_sendf(&ftpc->pp, "%s", "SYST");
            if(result) {
              free(dir);
              return result;
            }
            Curl_safefree(ftpc->entrypath);
            ftpc->entrypath = dir; /* remember this */
            infof(data, "Entry path is '%s'\n", ftpc->entrypath);
            /* also save it where getinfo can access it: */
            data->state.most_recent_ftp_entrypath = ftpc->entrypath;
            state(conn, FTP_SYST);
            break;
          }

          Curl_safefree(ftpc->entrypath);
          ftpc->entrypath = dir; /* remember this */
          infof(data, "Entry path is '%s'\n", ftpc->entrypath);
          /* also save it where getinfo can access it: */
          data->state.most_recent_ftp_entrypath = ftpc->entrypath;
        }
        else {
          /* couldn't get the path */
          free(dir);
          infof(data, "Failed to figure out path\n");
        }
      }
      state(conn, FTP_STOP); /* we are done with the CONNECT phase! */
      DEBUGF(infof(data, "protocol connect phase DONE\n"));
      break;

    case FTP_SYST:
      if(ftpcode == 215) {
        char *ptr = &data->state.buffer[4];  /* start on the first letter */
        char *os;
        char *store;

        os = malloc(nread + 1);
        if(!os)
          return CURLE_OUT_OF_MEMORY;

        /* Reply format is like
           215<space><OS-name><space><commentary>
        */
        while(*ptr == ' ')
          ptr++;
        for(store = os; *ptr && *ptr != ' ';)
          *store++ = *ptr++;
        *store = '\0'; /* zero terminate */

        /* Check for special servers here. */

        if(strcasecompare(os, "OS/400")) {
          /* Force OS400 name format 1. */
          result = Curl_pp_sendf(&ftpc->pp, "%s", "SITE NAMEFMT 1");
          if(result) {
            free(os);
            return result;
          }
          /* remember target server OS */
          Curl_safefree(ftpc->server_os);
          ftpc->server_os = os;
          state(conn, FTP_NAMEFMT);
          break;
        }
        /* Nothing special for the target server. */
        /* remember target server OS */
        Curl_safefree(ftpc->server_os);
        ftpc->server_os = os;
      }
      else {
        /* Cannot identify server OS. Continue anyway and cross fingers. */
      }

      state(conn, FTP_STOP); /* we are done with the CONNECT phase! */
      DEBUGF(infof(data, "protocol connect phase DONE\n"));
      break;

    case FTP_NAMEFMT:
      if(ftpcode == 250) {
        /* Name format change successful: reload initial path. */
        ftp_state_pwd(conn);
        break;
      }

      state(conn, FTP_STOP); /* we are done with the CONNECT phase! */
      DEBUGF(infof(data, "protocol connect phase DONE\n"));
      break;

    case FTP_QUOTE:
    case FTP_POSTQUOTE:
    case FTP_RETR_PREQUOTE:
    case FTP_STOR_PREQUOTE:
      if((ftpcode >= 400) && !ftpc->count2) {
        /* failure response code, and not allowed to fail */
        failf(conn->data, "QUOT command failed with %03d", ftpcode);
        return CURLE_QUOTE_ERROR;
      }
      result = ftp_state_quote(conn, FALSE, ftpc->state);
      if(result)
        return result;

      break;

    case FTP_CWD:
      if(ftpcode/100 != 2) {
        /* failure to CWD there */
        if(conn->data->set.ftp_create_missing_dirs &&
           ftpc->cwdcount && !ftpc->count2) {
          /* try making it */
          ftpc->count2++; /* counter to prevent CWD-MKD loops */
          PPSENDF(&ftpc->pp, "MKD %s", ftpc->dirs[ftpc->cwdcount - 1]);
          state(conn, FTP_MKD);
        }
        else {
          /* return failure */
          failf(data, "Server denied you to change to the given directory");
          ftpc->cwdfail = TRUE; /* don't remember this path as we failed
                                   to enter it */
          return CURLE_REMOTE_ACCESS_DENIED;
        }
      }
      else {
        /* success */
        ftpc->count2 = 0;
        if(++ftpc->cwdcount <= ftpc->dirdepth) {
          /* send next CWD */
          PPSENDF(&ftpc->pp, "CWD %s", ftpc->dirs[ftpc->cwdcount - 1]);
        }
        else {
          result = ftp_state_mdtm(conn);
          if(result)
            return result;
        }
      }
      break;

    case FTP_MKD:
      if((ftpcode/100 != 2) && !ftpc->count3--) {
        /* failure to MKD the dir */
        failf(data, "Failed to MKD dir: %03d", ftpcode);
        return CURLE_REMOTE_ACCESS_DENIED;
      }
      state(conn, FTP_CWD);
      /* send CWD */
      PPSENDF(&ftpc->pp, "CWD %s", ftpc->dirs[ftpc->cwdcount - 1]);
      break;

    case FTP_MDTM:
      result = ftp_state_mdtm_resp(conn, ftpcode);
      break;

    case FTP_TYPE:
    case FTP_LIST_TYPE:
    case FTP_RETR_TYPE:
    case FTP_STOR_TYPE:
      result = ftp_state_type_resp(conn, ftpcode, ftpc->state);
      break;

    case FTP_SIZE:
    case FTP_RETR_SIZE:
    case FTP_STOR_SIZE:
      result = ftp_state_size_resp(conn, ftpcode, ftpc->state);
      break;

    case FTP_REST:
    case FTP_RETR_REST:
      result = ftp_state_rest_resp(conn, ftpcode, ftpc->state);
      break;

    case FTP_PRET:
      if(ftpcode != 200) {
        /* there only is this one standard OK return code. */
        failf(data, "PRET command not accepted: %03d", ftpcode);
        return CURLE_FTP_PRET_FAILED;
      }
      result = ftp_state_use_pasv(conn);
      break;

    case FTP_PASV:
      result = ftp_state_pasv_resp(conn, ftpcode);
      break;

    case FTP_PORT:
      result = ftp_state_port_resp(conn, ftpcode);
      break;

    case FTP_LIST:
    case FTP_RETR:
      result = ftp_state_get_resp(conn, ftpcode, ftpc->state);
      break;

    case FTP_STOR:
      result = ftp_state_stor_resp(conn, ftpcode, ftpc->state);
      break;

    case FTP_QUIT:
      /* fallthrough, just stop! */
    default:
      /* internal error */
      state(conn, FTP_STOP);
      break;
    }
  } /* if(ftpcode) */

  return result;
}